

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.c
# Opt level: O0

void init_wedge_masks(void)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint8_t *puVar5;
  ulong uVar6;
  int w;
  int bh;
  int bw;
  uint8_t *mask;
  int wtypes;
  wedge_params_type *wedge_params;
  BLOCK_SIZE bsize;
  uint8_t *dst;
  int local_34;
  BLOCK_SIZE local_9;
  uint8_t *local_8;
  
  local_8 = wedge_mask_buf;
  memset(wedge_masks,0,0x1600);
  for (local_9 = BLOCK_4X4; local_9 < BLOCK_SIZES_ALL; local_9 = local_9 + BLOCK_4X8) {
    uVar6 = (ulong)local_9;
    iVar2 = av1_wedge_params_lookup[uVar6].wedge_types;
    if (iVar2 != 0) {
      bVar1 = block_size_wide[local_9];
      uVar3 = (uint)bVar1;
      uVar4 = (uint)block_size_high[local_9];
      for (local_34 = 0; local_34 < iVar2; local_34 = local_34 + 1) {
        puVar5 = get_wedge_mask_inplace(local_34,0,local_9);
        (*aom_convolve_copy)(puVar5,0x40,local_8,(ulong)bVar1,uVar3,uVar4);
        (*av1_wedge_params_lookup[uVar6].masks)[local_34] = local_8;
        local_8 = local_8 + (int)(uVar3 * uVar4);
        puVar5 = get_wedge_mask_inplace(local_34,1,local_9);
        (*aom_convolve_copy)(puVar5,0x40,local_8,(ulong)bVar1,uVar3,uVar4);
        av1_wedge_params_lookup[uVar6].masks[1][local_34] = local_8;
        local_8 = local_8 + (int)(uVar3 * uVar4);
      }
    }
  }
  return;
}

Assistant:

static inline void init_wedge_masks(void) {
  uint8_t *dst = wedge_mask_buf;
  BLOCK_SIZE bsize;
  memset(wedge_masks, 0, sizeof(wedge_masks));
  for (bsize = BLOCK_4X4; bsize < BLOCK_SIZES_ALL; ++bsize) {
    const wedge_params_type *wedge_params = &av1_wedge_params_lookup[bsize];
    const int wtypes = wedge_params->wedge_types;
    if (wtypes == 0) continue;
    const uint8_t *mask;
    const int bw = block_size_wide[bsize];
    const int bh = block_size_high[bsize];
    int w;
    for (w = 0; w < wtypes; ++w) {
      mask = get_wedge_mask_inplace(w, 0, bsize);
      aom_convolve_copy(mask, MASK_MASTER_STRIDE, dst, bw /* dst_stride */, bw,
                        bh);
      wedge_params->masks[0][w] = dst;
      dst += bw * bh;

      mask = get_wedge_mask_inplace(w, 1, bsize);
      aom_convolve_copy(mask, MASK_MASTER_STRIDE, dst, bw /* dst_stride */, bw,
                        bh);
      wedge_params->masks[1][w] = dst;
      dst += bw * bh;
    }
    assert(sizeof(wedge_mask_buf) >= (size_t)(dst - wedge_mask_buf));
  }
}